

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcessTools.h
# Opt level: O2

void __thiscall cmProcessTools::OutputLogger::~OutputLogger(OutputLogger *this)

{
  LineParser::~LineParser(&this->super_LineParser);
  operator_delete(this,0x40);
  return;
}

Assistant:

OutputLogger(std::ostream& log, const char* prefix = nullptr)
    {
      this->SetLog(&log, prefix);
    }